

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore_desktop_glfw.c
# Opt level: O1

int InitPlatform(void)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  GLFWmonitor *monitor;
  GLFWmonitor **ppGVar5;
  GLFWvidmode *pGVar6;
  char (*__dest) [64];
  long lVar7;
  char *pcVar8;
  int i;
  ulong uVar9;
  ulong uVar10;
  float fVar11;
  float fVar12;
  int fbHeight;
  int count;
  int monitorHeight;
  int monitorWidth;
  uint local_5c;
  timespec local_58;
  float local_3c;
  int local_38;
  int local_34;
  
  glfwSetErrorCallback(ErrorCallback);
  iVar2 = glfwInit();
  if (iVar2 == 0) {
    pcVar8 = "GLFW: Failed to initialize GLFW";
  }
  else {
    glfwDefaultWindowHints();
    glfwWindowHint(0x20006,0);
    if ((CORE.Window.flags & 2) != 0) {
      CORE.Window.fullscreen = true;
    }
    glfwWindowHint(0x20004,(uint)(-1 < (char)CORE.Window.flags));
    glfwWindowHint(0x20005,(uint)((CORE.Window.flags & 8) == 0));
    glfwWindowHint(0x20003,CORE.Window.flags >> 2 & 1);
    if ((CORE.Window.flags >> 9 & 1) != 0) {
      CORE.Window.flags = CORE.Window.flags & 0xfffffdff;
    }
    if ((CORE.Window.flags >> 10 & 1) != 0) {
      CORE.Window.flags = CORE.Window.flags & 0xfffffbff;
    }
    glfwWindowHint(0x20001,(uint)((CORE.Window.flags >> 0xb & 1) == 0));
    glfwWindowHint(0x20007,CORE.Window.flags >> 0xc & 1);
    glfwWindowHint(0x2000a,CORE.Window.flags >> 4 & 1);
    glfwWindowHint(0x2200c,CORE.Window.flags >> 0xd & 1);
    glfwWindowHint(0x2000d,CORE.Window.flags >> 0xe & 1);
    if ((CORE.Window.flags & 0x20) != 0) {
      TraceLog(3,"DISPLAY: Trying to enable MSAA x4");
      glfwWindowHint(0x2100d,4);
    }
    glfwWindowHint(0x22002,3);
    glfwWindowHint(0x22003,3);
    glfwWindowHint(0x22008,0x32001);
    glfwWindowHint(0x22006,0);
    glfwSetJoystickCallback((GLFWjoystickfun)0x0);
    if (CORE.Window.fullscreen == true) {
      monitor = glfwGetPrimaryMonitor();
      if (monitor == (GLFWmonitor *)0x0) {
        pcVar8 = "GLFW: Failed to get primary monitor";
        goto LAB_00128cce;
      }
      SetDimensionsFromMonitor(monitor);
      if ((CORE.Window.screen.height == CORE.Window.display.height) &&
         (CORE.Window.screen.width == CORE.Window.display.width)) {
        CORE.Window.position.x = CORE.Window.display.width >> 2;
        CORE.Window.position.y = CORE.Window.display.height >> 2;
      }
      else {
        CORE.Window.position.x = (CORE.Window.display.width >> 1) - (CORE.Window.screen.width >> 1);
        CORE.Window.position.y =
             (CORE.Window.display.height >> 1) - (CORE.Window.screen.height >> 1);
      }
      if (CORE.Window.position.x < 0) {
        CORE.Window.position.x = 0;
      }
      if (CORE.Window.position.y < 0) {
        CORE.Window.position.y = 0;
      }
      local_58.tv_sec = local_58.tv_sec & 0xffffffff00000000;
      pGVar6 = glfwGetVideoModes(monitor,(int *)&local_58);
      if (0 < (long)(int)(uint)local_58.tv_sec) {
        lVar7 = 0;
        do {
          uVar4 = *(uint *)((long)&pGVar6->width + lVar7);
          if ((CORE.Window.screen.width <= uVar4) &&
             (CORE.Window.screen.height <= *(uint *)((long)&pGVar6->height + lVar7))) {
            CORE.Window.display.height = *(uint *)((long)&pGVar6->height + lVar7);
            CORE.Window.display.width = uVar4;
            break;
          }
          lVar7 = lVar7 + 0x18;
        } while ((long)(int)(uint)local_58.tv_sec * 0x18 != lVar7);
      }
      TraceLog(3,"SYSTEM: Closest fullscreen videomode: %i x %i",(ulong)CORE.Window.display.width,
               (ulong)CORE.Window.display.height);
      if ((CORE.Window.display.width < CORE.Window.screen.width) ||
         (CORE.Window.display.height < CORE.Window.screen.height)) {
        iVar2 = 0;
        TraceLog(4,
                 "DISPLAY: Downscaling required: Screen size (%ix%i) is bigger than display size (%ix%i)"
                 ,(ulong)CORE.Window.screen & 0xffffffff,(ulong)CORE.Window.screen.height,
                 (ulong)CORE.Window.display.width,(ulong)CORE.Window.display.height);
        uVar1 = CORE.Window.display.height;
        uVar4 = CORE.Window.display.width;
        uVar9 = (ulong)CORE.Window.display.width;
        local_3c = (float)((ulong)CORE.Window.screen & 0xffffffff);
        uVar10 = (ulong)CORE.Window.display.height;
        fVar11 = (float)uVar9 / local_3c;
        fVar12 = (float)uVar10 / (float)((ulong)CORE.Window.screen >> 0x20);
        if (fVar11 <= fVar12) {
          CORE.Window.render.width = CORE.Window.display.width;
          fVar11 = roundf(fVar11 * (float)((ulong)CORE.Window.screen >> 0x20));
          CORE.Window.render = (Size)((ulong)CORE.Window.render & 0xffffffff);
          CORE.Window.renderOffset.x = 0;
          iVar2 = uVar1 - (int)fVar11;
        }
        else {
          fVar11 = roundf(fVar12 * local_3c);
          CORE.Window.render.height = 0;
          CORE.Window.render.width = (int)fVar11;
          CORE.Window.renderOffset.x = uVar4 - (int)fVar11;
        }
        CORE.Window.renderOffset.y = iVar2;
        CORE.Window.screenScale.m0 = (float)(long)CORE.Window.render / local_3c;
        CORE.Window.screenScale.m4 = 0.0;
        CORE.Window.screenScale.m8 = 0.0;
        CORE.Window.screenScale.m12 = 0.0;
        CORE.Window.screenScale.m1 = 0.0;
        CORE.Window.screenScale.m9 = 0.0;
        CORE.Window.screenScale.m13 = 0.0;
        CORE.Window.screenScale.m2 = 0.0;
        CORE.Window.screenScale.m6 = 0.0;
        CORE.Window.screenScale.m10 = 1.0;
        CORE.Window.screenScale.m14 = 0.0;
        CORE.Window.screenScale.m3 = 0.0;
        CORE.Window.screenScale.m7 = 0.0;
        CORE.Window.screenScale.m11 = 0.0;
        CORE.Window.screenScale.m15 = 1.0;
        CORE.Window.render.height = uVar1;
        CORE.Window.render.width = uVar4;
        CORE.Window.screenScale.m5 = CORE.Window.screenScale.m0;
        TraceLog(4,"DISPLAY: Downscale matrix generated, content will be rendered at (%ix%i)",uVar9,
                 uVar10);
      }
      else if (CORE.Window.screen.width < CORE.Window.display.width ||
               CORE.Window.screen.height < CORE.Window.display.height) {
        TraceLog(3,
                 "DISPLAY: Upscaling required: Screen size (%ix%i) smaller than display size (%ix%i)"
                );
        if ((CORE.Window.screen.width == 0) || (CORE.Window.screen.height == 0)) {
          CORE.Window.screen.height = CORE.Window.display.height;
          CORE.Window.screen.width = CORE.Window.display.width;
        }
        fVar11 = (float)CORE.Window.display.width / (float)CORE.Window.display.height;
        uVar4 = CORE.Window.screen.width;
        uVar1 = CORE.Window.screen.height;
        if (fVar11 <= (float)((ulong)CORE.Window.screen & 0xffffffff) /
                      (float)CORE.Window.screen.height) {
          CORE.Window.render.width = CORE.Window.screen.width;
          fVar11 = roundf((float)((ulong)CORE.Window.screen & 0xffffffff) / fVar11);
          CORE.Window.render.height = (int)fVar11;
          CORE.Window.renderOffset.x = 0;
          CORE.Window.renderOffset.y = (int)fVar11 - uVar1;
        }
        else {
          fVar11 = roundf(fVar11 * (float)CORE.Window.screen.height);
          CORE.Window.render.height = uVar1;
          CORE.Window.render.width = (int)fVar11;
          CORE.Window.renderOffset.x = (int)fVar11 - uVar4;
          CORE.Window.renderOffset.y = 0;
        }
      }
      else {
        CORE.Window.render = CORE.Window.screen;
        CORE.Window.renderOffset.x = 0;
        CORE.Window.renderOffset.y = 0;
      }
      pcVar8 = " ";
      if (CORE.Window.title != (char *)0x0) {
        pcVar8 = CORE.Window.title;
      }
      platform.handle =
           glfwCreateWindow(CORE.Window.display.width,CORE.Window.display.height,pcVar8,monitor,
                            (GLFWwindow *)0x0);
    }
    else {
      uVar1 = CORE.Window.screen.height;
      uVar4 = CORE.Window.screen.width;
      pcVar8 = " ";
      if (CORE.Window.title != (char *)0x0) {
        pcVar8 = CORE.Window.title;
      }
      platform.handle =
           glfwCreateWindow(CORE.Window.screen.width + (CORE.Window.screen.width == 0),
                            CORE.Window.screen.height + (CORE.Window.screen.height == 0),pcVar8,
                            (GLFWmonitor *)0x0,(GLFWwindow *)0x0);
      local_58.tv_sec = local_58.tv_sec & 0xffffffff00000000;
      iVar3 = GetCurrentMonitor();
      ppGVar5 = glfwGetMonitors((int *)&local_58);
      iVar2 = (uint)local_58.tv_sec;
      if (iVar3 < (int)(uint)local_58.tv_sec) {
        monitor = ppGVar5[iVar3];
        SetDimensionsFromMonitor(monitor);
        if (uVar4 == 0 && uVar1 == 0) {
          glfwSetWindowSize(platform.handle,CORE.Window.screen.width,CORE.Window.screen.height);
        }
        if (platform.handle != (GLFWwindow *)0x0) {
          CORE.Window.render = CORE.Window.screen;
        }
      }
      else {
        glfwTerminate();
        monitor = (GLFWmonitor *)0x0;
        TraceLog(4,"GLFW: Failed to determine Monitor to center Window");
      }
      if (iVar2 <= iVar3) {
        return -1;
      }
    }
    if (platform.handle != (GLFWwindow *)0x0) {
      glfwMakeContextCurrent(platform.handle);
      uVar4 = glfwGetError((char **)0x0);
      if ((uVar4 & 0xfffffffd) == 0x10008) {
        pcVar8 = "PLATFORM: Failed to initialize graphics device";
      }
      else {
        CORE.Window.ready = true;
        glfwSwapInterval(0);
        if ((CORE.Window.flags & 0x40) != 0) {
          glfwSwapInterval(1);
          TraceLog(3,"DISPLAY: Trying to enable VSYNC");
        }
        local_58.tv_sec = CONCAT44(local_58.tv_sec._4_4_,CORE.Window.screen.width);
        local_5c = CORE.Window.screen.height;
        if ((CORE.Window.flags & 0x2000) != 0) {
          glfwGetFramebufferSize(platform.handle,(int *)&local_58,(int *)&local_5c);
          CORE.Window.screenScale.m0 =
               (float)(int)(uint)local_58.tv_sec / (float)((ulong)CORE.Window.screen & 0xffffffff);
          CORE.Window.screenScale.m5 =
               (float)(int)local_5c / (float)((ulong)CORE.Window.screen >> 0x20);
          CORE.Window.screenScale.m4 = 0.0;
          CORE.Window.screenScale.m8 = 0.0;
          CORE.Window.screenScale.m12 = 0.0;
          CORE.Window.screenScale.m1 = 0.0;
          CORE.Window.screenScale.m9 = 0.0;
          CORE.Window.screenScale.m13 = 0.0;
          CORE.Window.screenScale.m2 = 0.0;
          CORE.Window.screenScale.m6 = 0.0;
          CORE.Window.screenScale.m10 = 1.0;
          CORE.Window.screenScale.m14 = 0.0;
          CORE.Window.screenScale.m3 = 0.0;
          CORE.Window.screenScale.m7 = 0.0;
          CORE.Window.screenScale.m11 = 0.0;
          CORE.Window.screenScale.m15 = 1.0;
          CORE.Input.Mouse.scale.x =
               (float)((ulong)CORE.Window.screen & 0xffffffff) / (float)(int)(uint)local_58.tv_sec;
          CORE.Input.Mouse.scale.y =
               (float)((ulong)CORE.Window.screen >> 0x20) / (float)(int)local_5c;
        }
        CORE.Window.render.height = local_5c;
        CORE.Window.render.width = (uint)local_58.tv_sec;
        CORE.Window.currentFbo.width = (uint)local_58.tv_sec;
        CORE.Window.currentFbo.height = local_5c;
        TraceLog(3,"DISPLAY: Device initialized successfully");
        TraceLog(3,"    > Display size: %i x %i",(ulong)CORE.Window.display.width,
                 (ulong)CORE.Window.display.height);
        TraceLog(3,"    > Screen size:  %i x %i",(ulong)CORE.Window.screen & 0xffffffff,
                 (ulong)CORE.Window.screen >> 0x20);
        TraceLog(3,"    > Render size:  %i x %i",(ulong)CORE.Window.render & 0xffffffff,
                 (ulong)CORE.Window.render >> 0x20);
        TraceLog(3,"    > Viewport offsets: %i, %i",(ulong)CORE.Window.renderOffset & 0xffffffff,
                 (ulong)CORE.Window.renderOffset >> 0x20);
        if ((CORE.Window.flags & 0x200) != 0) {
          glfwIconifyWindow(platform.handle);
        }
        if (CORE.Window.ready != false) {
          local_58.tv_sec = local_58.tv_sec & 0xffffffff00000000;
          local_5c = 0;
          local_34 = 0;
          local_38 = 0;
          glfwGetMonitorWorkarea(monitor,(int *)&local_58,(int *)&local_5c,&local_34,&local_38);
          uVar4 = (int)(local_38 - CORE.Window.render.height) / 2 + local_5c;
          iVar2 = (int)(local_34 - CORE.Window.render.width) / 2;
          if ((int)(local_34 - CORE.Window.render.width) < -1) {
            iVar2 = 0;
          }
          iVar2 = iVar2 + (uint)local_58.tv_sec;
          if ((int)uVar4 <= (int)local_5c) {
            uVar4 = local_5c;
          }
          CORE.Window.position.x = iVar2;
          CORE.Window.position.y = uVar4;
          glfwSetWindowPos(platform.handle,iVar2,uVar4);
          CORE.Window.position.x = iVar2;
          CORE.Window.position.y = uVar4;
          rlLoadExtensions(glfwGetProcAddress);
          glfwSetWindowSizeCallback(platform.handle,WindowSizeCallback);
          glfwSetWindowPosCallback(platform.handle,WindowPosCallback);
          glfwSetWindowMaximizeCallback(platform.handle,WindowMaximizeCallback);
          glfwSetWindowIconifyCallback(platform.handle,WindowIconifyCallback);
          glfwSetWindowFocusCallback(platform.handle,WindowFocusCallback);
          glfwSetDropCallback(platform.handle,WindowDropCallback);
          if ((CORE.Window.flags & 0x2000) != 0) {
            glfwSetWindowContentScaleCallback(platform.handle,WindowContentScaleCallback);
          }
          glfwSetKeyCallback(platform.handle,KeyCallback);
          glfwSetCharCallback(platform.handle,CharCallback);
          glfwSetMouseButtonCallback(platform.handle,MouseButtonCallback);
          glfwSetCursorPosCallback(platform.handle,MouseCursorPosCallback);
          glfwSetScrollCallback(platform.handle,MouseScrollCallback);
          glfwSetCursorEnterCallback(platform.handle,CursorEnterCallback);
          glfwSetJoystickCallback(JoystickCallback);
          glfwSetInputMode(platform.handle,0x33004,1);
          __dest = CORE.Input.Gamepad.name;
          lVar7 = 0;
          do {
            iVar2 = glfwJoystickPresent((int)lVar7);
            if (iVar2 != 0) {
              pcVar8 = glfwGetJoystickName((int)lVar7);
              strcpy(*__dest,pcVar8);
            }
            lVar7 = lVar7 + 1;
            __dest = __dest + 1;
          } while (lVar7 != 4);
          local_58.tv_sec = 0;
          local_58.tv_nsec = 0;
          iVar2 = clock_gettime(1,&local_58);
          if (iVar2 == 0) {
            CORE.Time.base = local_58.tv_sec * 1000000000 + local_58.tv_nsec;
          }
          else {
            TraceLog(4,"TIMER: Hi-resolution timer not available");
          }
          CORE.Time.previous = glfwGetTime();
          memset(GetWorkingDirectory::currentDir,0,0x1000);
          CORE.Storage.basePath = getcwd(GetWorkingDirectory::currentDir,0xfff);
          iVar2 = glfwGetPlatform();
          if (iVar2 - 0x60001U < 5) {
            pcVar8 = &DAT_0018a5d0 + *(int *)(&DAT_0018a5d0 + (ulong)(iVar2 - 0x60001U) * 4);
          }
          else {
            pcVar8 = "";
          }
          TraceLog(3,"PLATFORM: DESKTOP (GLFW - %s): Initialized successfully",pcVar8);
          return 0;
        }
        pcVar8 = "PLATFORM: Failed to initialize graphic device";
      }
      iVar2 = 6;
      goto LAB_001290e3;
    }
    glfwTerminate();
    pcVar8 = "GLFW: Failed to initialize Window";
  }
LAB_00128cce:
  iVar2 = 4;
LAB_001290e3:
  TraceLog(iVar2,pcVar8);
  return -1;
}

Assistant:

int InitPlatform(void)
{
    glfwSetErrorCallback(ErrorCallback);
/*
    // TODO: Setup GLFW custom allocators to match raylib ones
    const GLFWallocator allocator = {
        .allocate = MemAlloc,
        .deallocate = MemFree,
        .reallocate = MemRealloc,
        .user = NULL
    };

    glfwInitAllocator(&allocator);
*/

#if defined(__APPLE__)
    glfwInitHint(GLFW_COCOA_CHDIR_RESOURCES, GLFW_FALSE);
#endif
    // Initialize GLFW internal global state
    int result = glfwInit();
    if (result == GLFW_FALSE) { TRACELOG(LOG_WARNING, "GLFW: Failed to initialize GLFW"); return -1; }

    // Initialize graphic device: display/window and graphic context
    //----------------------------------------------------------------------------
    glfwDefaultWindowHints();                       // Set default windows hints
    //glfwWindowHint(GLFW_RED_BITS, 8);             // Framebuffer red color component bits
    //glfwWindowHint(GLFW_GREEN_BITS, 8);           // Framebuffer green color component bits
    //glfwWindowHint(GLFW_BLUE_BITS, 8);            // Framebuffer blue color component bits
    //glfwWindowHint(GLFW_ALPHA_BITS, 8);           // Framebuffer alpha color component bits
    //glfwWindowHint(GLFW_DEPTH_BITS, 24);          // Depthbuffer bits
    //glfwWindowHint(GLFW_REFRESH_RATE, 0);         // Refresh rate for fullscreen window
    //glfwWindowHint(GLFW_CLIENT_API, GLFW_OPENGL_API); // OpenGL API to use. Alternative: GLFW_OPENGL_ES_API
    //glfwWindowHint(GLFW_AUX_BUFFERS, 0);          // Number of auxiliar buffers

    // Disable GlFW auto iconify behaviour
    // Auto Iconify automatically minimizes (iconifies) the window if the window loses focus
    // additionally auto iconify restores the hardware resolution of the monitor if the window that loses focus is a fullscreen window
    glfwWindowHint(GLFW_AUTO_ICONIFY, 0);

    // Check window creation flags
    if ((CORE.Window.flags & FLAG_FULLSCREEN_MODE) > 0) CORE.Window.fullscreen = true;

    if ((CORE.Window.flags & FLAG_WINDOW_HIDDEN) > 0) glfwWindowHint(GLFW_VISIBLE, GLFW_FALSE); // Visible window
    else glfwWindowHint(GLFW_VISIBLE, GLFW_TRUE);     // Window initially hidden

    if ((CORE.Window.flags & FLAG_WINDOW_UNDECORATED) > 0) glfwWindowHint(GLFW_DECORATED, GLFW_FALSE); // Border and buttons on Window
    else glfwWindowHint(GLFW_DECORATED, GLFW_TRUE);   // Decorated window

    if ((CORE.Window.flags & FLAG_WINDOW_RESIZABLE) > 0) glfwWindowHint(GLFW_RESIZABLE, GLFW_TRUE); // Resizable window
    else glfwWindowHint(GLFW_RESIZABLE, GLFW_FALSE);  // Avoid window being resizable

    // Disable FLAG_WINDOW_MINIMIZED, not supported on initialization
    if ((CORE.Window.flags & FLAG_WINDOW_MINIMIZED) > 0) CORE.Window.flags &= ~FLAG_WINDOW_MINIMIZED;

    // Disable FLAG_WINDOW_MAXIMIZED, not supported on initialization
    if ((CORE.Window.flags & FLAG_WINDOW_MAXIMIZED) > 0) CORE.Window.flags &= ~FLAG_WINDOW_MAXIMIZED;

    if ((CORE.Window.flags & FLAG_WINDOW_UNFOCUSED) > 0) glfwWindowHint(GLFW_FOCUSED, GLFW_FALSE);
    else glfwWindowHint(GLFW_FOCUSED, GLFW_TRUE);

    if ((CORE.Window.flags & FLAG_WINDOW_TOPMOST) > 0) glfwWindowHint(GLFW_FLOATING, GLFW_TRUE);
    else glfwWindowHint(GLFW_FLOATING, GLFW_FALSE);

    // NOTE: Some GLFW flags are not supported on HTML5
    if ((CORE.Window.flags & FLAG_WINDOW_TRANSPARENT) > 0) glfwWindowHint(GLFW_TRANSPARENT_FRAMEBUFFER, GLFW_TRUE);     // Transparent framebuffer
    else glfwWindowHint(GLFW_TRANSPARENT_FRAMEBUFFER, GLFW_FALSE);  // Opaque framebuffer

    if ((CORE.Window.flags & FLAG_WINDOW_HIGHDPI) > 0)
    {
        // Resize window content area based on the monitor content scale.
        // NOTE: This hint only has an effect on platforms where screen coordinates and pixels always map 1:1 such as Windows and X11.
        // On platforms like macOS the resolution of the framebuffer is changed independently of the window size.
        glfwWindowHint(GLFW_SCALE_TO_MONITOR, GLFW_TRUE);   // Scale content area based on the monitor content scale where window is placed on
#if defined(__APPLE__)
        glfwWindowHint(GLFW_COCOA_RETINA_FRAMEBUFFER, GLFW_TRUE);
#endif
    }
    else glfwWindowHint(GLFW_SCALE_TO_MONITOR, GLFW_FALSE);

    // Mouse passthrough
    if ((CORE.Window.flags & FLAG_WINDOW_MOUSE_PASSTHROUGH) > 0) glfwWindowHint(GLFW_MOUSE_PASSTHROUGH, GLFW_TRUE);
    else glfwWindowHint(GLFW_MOUSE_PASSTHROUGH, GLFW_FALSE);

    if (CORE.Window.flags & FLAG_MSAA_4X_HINT)
    {
        // NOTE: MSAA is only enabled for main framebuffer, not user-created FBOs
        TRACELOG(LOG_INFO, "DISPLAY: Trying to enable MSAA x4");
        glfwWindowHint(GLFW_SAMPLES, 4);   // Tries to enable multisampling x4 (MSAA), default is 0
    }

    // NOTE: When asking for an OpenGL context version, most drivers provide the highest supported version
    // with backward compatibility to older OpenGL versions.
    // For example, if using OpenGL 1.1, driver can provide a 4.3 backwards compatible context.

    // Check selection OpenGL version
    if (rlGetVersion() == RL_OPENGL_21)
    {
        glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 2);          // Choose OpenGL major version (just hint)
        glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 1);          // Choose OpenGL minor version (just hint)
    }
    else if (rlGetVersion() == RL_OPENGL_33)
    {
        glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 3);          // Choose OpenGL major version (just hint)
        glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 3);          // Choose OpenGL minor version (just hint)
        glfwWindowHint(GLFW_OPENGL_PROFILE, GLFW_OPENGL_CORE_PROFILE); // Profiles Hint: Only 3.3 and above!
                                                                       // Values: GLFW_OPENGL_CORE_PROFILE, GLFW_OPENGL_ANY_PROFILE, GLFW_OPENGL_COMPAT_PROFILE
#if defined(__APPLE__)
        glfwWindowHint(GLFW_OPENGL_FORWARD_COMPAT, GLFW_TRUE);  // OSX Requires forward compatibility
#else
        glfwWindowHint(GLFW_OPENGL_FORWARD_COMPAT, GLFW_FALSE); // Forward Compatibility Hint: Only 3.3 and above!
#endif
        //glfwWindowHint(GLFW_OPENGL_DEBUG_CONTEXT, GLFW_TRUE); // Request OpenGL DEBUG context
    }
    else if (rlGetVersion() == RL_OPENGL_43)
    {
        glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 4);          // Choose OpenGL major version (just hint)
        glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 3);          // Choose OpenGL minor version (just hint)
        glfwWindowHint(GLFW_OPENGL_PROFILE, GLFW_OPENGL_CORE_PROFILE);
        glfwWindowHint(GLFW_OPENGL_FORWARD_COMPAT, GLFW_FALSE);
#if defined(RLGL_ENABLE_OPENGL_DEBUG_CONTEXT)
        glfwWindowHint(GLFW_OPENGL_DEBUG_CONTEXT, GLFW_TRUE);   // Enable OpenGL Debug Context
#endif
    }
    else if (rlGetVersion() == RL_OPENGL_ES_20)                 // Request OpenGL ES 2.0 context
    {
        glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 2);
        glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 0);
        glfwWindowHint(GLFW_CLIENT_API, GLFW_OPENGL_ES_API);
        glfwWindowHint(GLFW_CONTEXT_CREATION_API, GLFW_EGL_CONTEXT_API);
    }
    else if (rlGetVersion() == RL_OPENGL_ES_30)                 // Request OpenGL ES 3.0 context
    {
        glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 3);
        glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 0);
        glfwWindowHint(GLFW_CLIENT_API, GLFW_OPENGL_ES_API);
        glfwWindowHint(GLFW_CONTEXT_CREATION_API, GLFW_EGL_CONTEXT_API);
    }

    // NOTE: GLFW 3.4+ defers initialization of the Joystick subsystem on the first call to any Joystick related functions.
    // Forcing this initialization here avoids doing it on PollInputEvents() called by EndDrawing() after first frame has been just drawn.
    // The initialization will still happen and possible delays still occur, but before the window is shown, which is a nicer experience.
    // REF: https://github.com/raysan5/raylib/issues/1554
    glfwSetJoystickCallback(NULL);

    GLFWmonitor *monitor = NULL;
    if (CORE.Window.fullscreen)
    {
        // According to glfwCreateWindow(), if the user does not have a choice, fullscreen applications
        // should default to the primary monitor.

        monitor = glfwGetPrimaryMonitor();
        if (!monitor)
        {
          TRACELOG(LOG_WARNING, "GLFW: Failed to get primary monitor");
          return -1;
        }

        SetDimensionsFromMonitor(monitor);

        // Remember center for switching from fullscreen to window
        if ((CORE.Window.screen.height == CORE.Window.display.height) && (CORE.Window.screen.width == CORE.Window.display.width))
        {
            // If screen width/height equal to the display, we can't calculate the window pos for toggling full-screened/windowed.
            // Toggling full-screened/windowed with pos(0, 0) can cause problems in some platforms, such as X11.
            CORE.Window.position.x = CORE.Window.display.width/4;
            CORE.Window.position.y = CORE.Window.display.height/4;
        }
        else
        {
            CORE.Window.position.x = CORE.Window.display.width/2 - CORE.Window.screen.width/2;
            CORE.Window.position.y = CORE.Window.display.height/2 - CORE.Window.screen.height/2;
        }

        if (CORE.Window.position.x < 0) CORE.Window.position.x = 0;
        if (CORE.Window.position.y < 0) CORE.Window.position.y = 0;

        // Obtain recommended CORE.Window.display.width/CORE.Window.display.height from a valid videomode for the monitor
        int count = 0;
        const GLFWvidmode *modes = glfwGetVideoModes(monitor, &count);

        // Get closest video mode to desired CORE.Window.screen.width/CORE.Window.screen.height
        for (int i = 0; i < count; i++)
        {
            if ((unsigned int)modes[i].width >= CORE.Window.screen.width)
            {
                if ((unsigned int)modes[i].height >= CORE.Window.screen.height)
                {
                    CORE.Window.display.width = modes[i].width;
                    CORE.Window.display.height = modes[i].height;
                    break;
                }
            }
        }

        TRACELOG(LOG_INFO, "SYSTEM: Closest fullscreen videomode: %i x %i", CORE.Window.display.width, CORE.Window.display.height);

        // NOTE: ISSUE: Closest videomode could not match monitor aspect-ratio, for example,
        // for a desired screen size of 800x450 (16:9), closest supported videomode is 800x600 (4:3),
        // framebuffer is rendered correctly but once displayed on a 16:9 monitor, it gets stretched
        // by the sides to fit all monitor space...

        // Try to setup the most appropriate fullscreen framebuffer for the requested screenWidth/screenHeight
        // It considers device display resolution mode and setups a framebuffer with black bars if required (render size/offset)
        // Modified global variables: CORE.Window.screen.width/CORE.Window.screen.height - CORE.Window.render.width/CORE.Window.render.height - CORE.Window.renderOffset.x/CORE.Window.renderOffset.y - CORE.Window.screenScale
        // TODO: It is a quite cumbersome solution to display size vs requested size, it should be reviewed or removed...
        // HighDPI monitors are properly considered in a following similar function: SetupViewport()
        SetupFramebuffer(CORE.Window.display.width, CORE.Window.display.height);

        platform.handle = glfwCreateWindow(CORE.Window.display.width, CORE.Window.display.height, (CORE.Window.title != 0)? CORE.Window.title : " ", monitor, NULL);

        // NOTE: Full-screen change, not working properly...
        //glfwSetWindowMonitor(platform.handle, glfwGetPrimaryMonitor(), 0, 0, CORE.Window.screen.width, CORE.Window.screen.height, GLFW_DONT_CARE);
    }
    else
    {
        // No-fullscreen window creation
        bool requestWindowedFullscreen = (CORE.Window.screen.height == 0) && (CORE.Window.screen.width == 0);

        // Default to at least one pixel in size, as creation with a zero dimension is not allowed.
        int creationWidth = CORE.Window.screen.width != 0 ? CORE.Window.screen.width : 1;
        int creationHeight = CORE.Window.screen.height != 0 ? CORE.Window.screen.height : 1;

        platform.handle = glfwCreateWindow(creationWidth, creationHeight, (CORE.Window.title != 0)? CORE.Window.title : " ", NULL, NULL);

        // After the window was created, determine the monitor that the window manager assigned.
        // Derive display sizes, and, if possible, window size in case it was zero at beginning.

        int monitorCount = 0;
        int monitorIndex = GetCurrentMonitor();
        GLFWmonitor **monitors = glfwGetMonitors(&monitorCount);

        if (monitorIndex < monitorCount)
        {
            monitor = monitors[monitorIndex];
            SetDimensionsFromMonitor(monitor);

            if (requestWindowedFullscreen) glfwSetWindowSize(platform.handle, CORE.Window.screen.width, CORE.Window.screen.height);
        }
        else
        {
            // The monitor for the window-manager-created window can not be determined, so it can not be centered.
            glfwTerminate();
            TRACELOG(LOG_WARNING, "GLFW: Failed to determine Monitor to center Window");
            return -1;
        }

        if (platform.handle)
        {
            CORE.Window.render.width = CORE.Window.screen.width;
            CORE.Window.render.height = CORE.Window.screen.height;
        }
    }

    if (!platform.handle)
    {
        glfwTerminate();
        TRACELOG(LOG_WARNING, "GLFW: Failed to initialize Window");
        return -1;
    }

    glfwMakeContextCurrent(platform.handle);
    result = glfwGetError(NULL);

    // Check context activation
    if ((result != GLFW_NO_WINDOW_CONTEXT) && (result != GLFW_PLATFORM_ERROR))
    {
        CORE.Window.ready = true;

        glfwSwapInterval(0);        // No V-Sync by default

        // Try to enable GPU V-Sync, so frames are limited to screen refresh rate (60Hz -> 60 FPS)
        // NOTE: V-Sync can be enabled by graphic driver configuration, it doesn't need
        // to be activated on web platforms since VSync is enforced there.
        if (CORE.Window.flags & FLAG_VSYNC_HINT)
        {
            // WARNING: It seems to hit a critical render path in Intel HD Graphics
            glfwSwapInterval(1);
            TRACELOG(LOG_INFO, "DISPLAY: Trying to enable VSYNC");
        }

        int fbWidth = CORE.Window.screen.width;
        int fbHeight = CORE.Window.screen.height;

        if ((CORE.Window.flags & FLAG_WINDOW_HIGHDPI) > 0)
        {
            // NOTE: On APPLE platforms system should manage window/input scaling and also framebuffer scaling.
            // Framebuffer scaling should be activated with: glfwWindowHint(GLFW_COCOA_RETINA_FRAMEBUFFER, GLFW_TRUE);
    #if !defined(__APPLE__)
            glfwGetFramebufferSize(platform.handle, &fbWidth, &fbHeight);

            // Screen scaling matrix is required in case desired screen area is different from display area
            CORE.Window.screenScale = MatrixScale((float)fbWidth/CORE.Window.screen.width, (float)fbHeight/CORE.Window.screen.height, 1.0f);

            // Mouse input scaling for the new screen size
            SetMouseScale((float)CORE.Window.screen.width/fbWidth, (float)CORE.Window.screen.height/fbHeight);
    #endif
        }

        CORE.Window.render.width = fbWidth;
        CORE.Window.render.height = fbHeight;
        CORE.Window.currentFbo.width = fbWidth;
        CORE.Window.currentFbo.height = fbHeight;

        TRACELOG(LOG_INFO, "DISPLAY: Device initialized successfully");
        TRACELOG(LOG_INFO, "    > Display size: %i x %i", CORE.Window.display.width, CORE.Window.display.height);
        TRACELOG(LOG_INFO, "    > Screen size:  %i x %i", CORE.Window.screen.width, CORE.Window.screen.height);
        TRACELOG(LOG_INFO, "    > Render size:  %i x %i", CORE.Window.render.width, CORE.Window.render.height);
        TRACELOG(LOG_INFO, "    > Viewport offsets: %i, %i", CORE.Window.renderOffset.x, CORE.Window.renderOffset.y);
    }
    else
    {
        TRACELOG(LOG_FATAL, "PLATFORM: Failed to initialize graphics device");
        return -1;
    }

    if ((CORE.Window.flags & FLAG_WINDOW_MINIMIZED) > 0) MinimizeWindow();

    // If graphic device is no properly initialized, we end program
    if (!CORE.Window.ready) { TRACELOG(LOG_FATAL, "PLATFORM: Failed to initialize graphic device"); return -1; }
    else
    {
        // Try to center window on screen but avoiding window-bar outside of screen
        int monitorX = 0;
        int monitorY = 0;
        int monitorWidth = 0;
        int monitorHeight = 0;
        glfwGetMonitorWorkarea(monitor, &monitorX, &monitorY, &monitorWidth, &monitorHeight);

        // Here CORE.Window.render.width/height should be used instead of CORE.Window.screen.width/height to center the window correctly when the high dpi flag is enabled.
        int posX = monitorX + (monitorWidth - (int)CORE.Window.render.width)/2;
        int posY = monitorY + (monitorHeight - (int)CORE.Window.render.height)/2;
        if (posX < monitorX) posX = monitorX;
        if (posY < monitorY) posY = monitorY;
        SetWindowPosition(posX, posY);

        // Update CORE.Window.position here so it is correct from the start
        CORE.Window.position.x = posX;
        CORE.Window.position.y = posY;
    }

    // Load OpenGL extensions
    // NOTE: GL procedures address loader is required to load extensions
    rlLoadExtensions(glfwGetProcAddress);
    //----------------------------------------------------------------------------

    // Initialize input events callbacks
    //----------------------------------------------------------------------------
    // Set window callback events
    glfwSetWindowSizeCallback(platform.handle, WindowSizeCallback);      // NOTE: Resizing not allowed by default!
    glfwSetWindowPosCallback(platform.handle, WindowPosCallback);
    glfwSetWindowMaximizeCallback(platform.handle, WindowMaximizeCallback);
    glfwSetWindowIconifyCallback(platform.handle, WindowIconifyCallback);
    glfwSetWindowFocusCallback(platform.handle, WindowFocusCallback);
    glfwSetDropCallback(platform.handle, WindowDropCallback);

    if ((CORE.Window.flags & FLAG_WINDOW_HIGHDPI) > 0)
    {
       glfwSetWindowContentScaleCallback(platform.handle, WindowContentScaleCallback);
    }

    // Set input callback events
    glfwSetKeyCallback(platform.handle, KeyCallback);
    glfwSetCharCallback(platform.handle, CharCallback);
    glfwSetMouseButtonCallback(platform.handle, MouseButtonCallback);
    glfwSetCursorPosCallback(platform.handle, MouseCursorPosCallback);   // Track mouse position changes
    glfwSetScrollCallback(platform.handle, MouseScrollCallback);
    glfwSetCursorEnterCallback(platform.handle, CursorEnterCallback);
    glfwSetJoystickCallback(JoystickCallback);

    glfwSetInputMode(platform.handle, GLFW_LOCK_KEY_MODS, GLFW_TRUE);    // Enable lock keys modifiers (CAPS, NUM)

    // Retrieve gamepad names
    for (int i = 0; i < MAX_GAMEPADS; i++)
    {
        if (glfwJoystickPresent(i)) strcpy(CORE.Input.Gamepad.name[i], glfwGetJoystickName(i));
    }
    //----------------------------------------------------------------------------

    // Initialize timming system
    //----------------------------------------------------------------------------
    InitTimer();
    //----------------------------------------------------------------------------

    // Initialize storage system
    //----------------------------------------------------------------------------
    CORE.Storage.basePath = GetWorkingDirectory();
    //----------------------------------------------------------------------------

#if defined(__NetBSD__)
    // Workaround for NetBSD
    char *glfwPlatform = "X11";
#else
    char *glfwPlatform = "";
    switch (glfwGetPlatform())
    {
        case GLFW_PLATFORM_WIN32: glfwPlatform = "Win32"; break;
        case GLFW_PLATFORM_COCOA: glfwPlatform = "Cocoa"; break;
        case GLFW_PLATFORM_WAYLAND: glfwPlatform = "Wayland"; break;
        case GLFW_PLATFORM_X11: glfwPlatform = "X11"; break;
        case GLFW_PLATFORM_NULL: glfwPlatform = "Null"; break;
        default: break;
    }
#endif

    TRACELOG(LOG_INFO, "PLATFORM: DESKTOP (GLFW - %s): Initialized successfully", glfwPlatform);

    return 0;
}